

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_direct_speakers.cpp
# Opt level: O0

SpeakerPosition * __thiscall
ear::GainCalculatorDirectSpeakersImpl::_applyScreenEdgeLock
          (SpeakerPosition *__return_storage_ptr__,GainCalculatorDirectSpeakersImpl *this,
          SpeakerPosition *position)

{
  type in_R8B;
  GainCalculatorDirectSpeakersImpl *local_28;
  SpeakerPosition *local_20;
  SpeakerPosition *position_local;
  GainCalculatorDirectSpeakersImpl *this_local;
  
  local_28 = this;
  local_20 = position;
  position_local = (SpeakerPosition *)this;
  this_local = (GainCalculatorDirectSpeakersImpl *)__return_storage_ptr__;
  boost::
  apply_visitor<ear::GainCalculatorDirectSpeakersImpl::_applyScreenEdgeLock(boost::variant<ear::PolarSpeakerPosition,ear::CartesianSpeakerPosition>const&)::__0,boost::variant<ear::PolarSpeakerPosition,ear::CartesianSpeakerPosition>const&>
            (__return_storage_ptr__,(boost *)&local_28,(type *)position,
             (variant<ear::PolarSpeakerPosition,_ear::CartesianSpeakerPosition> *)0x1,in_R8B);
  return __return_storage_ptr__;
}

Assistant:

SpeakerPosition GainCalculatorDirectSpeakersImpl::_applyScreenEdgeLock(
      const SpeakerPosition& position) {
    return boost::apply_visitor(
        [this](const auto& p) {
          return SpeakerPosition(_applyScreenEdgeLock(p));
        },
        position);
  }